

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O0

ui_event object_skin_process_direction(menu_conflict *m,int dir)

{
  undefined4 uVar1;
  uint in_EDX;
  ui_event uVar2;
  int dir_local;
  menu_conflict *m_local;
  undefined4 uStack_10;
  ui_event out;
  
  stack0xffffffffffffffec = 0;
  if ((ddx[dir] == 0) || (ddy[dir] == 0)) {
    if (ddx[dir] == 0) {
      if (ddy[dir] != 0) {
        m->cursor = (int)ddy[dir] + m->cursor;
        stack0xffffffffffffffec = 0x20;
      }
    }
    else {
      in_EDX = (uint)ddx[dir];
      uVar1 = 0x82;
      if ((int)in_EDX < 0) {
        uVar1 = 0x81;
      }
      stack0xffffffffffffffec = CONCAT44(uVar1,0x80);
    }
  }
  uVar2._8_4_ = in_EDX & 0xffffff00;
  uVar2._0_4_ = m_local._4_4_;
  uVar2._4_1_ = (undefined1)uStack_10;
  uVar2._5_1_ = uStack_10._1_1_;
  uVar2._6_1_ = uStack_10._2_1_;
  uVar2._7_1_ = uStack_10._3_1_;
  return uVar2;
}

Assistant:

static ui_event object_skin_process_direction(struct menu *m, int dir)
{
	ui_event out = EVENT_EMPTY;

	/* Reject diagonals */
	if (ddx[dir] && ddy[dir])
		;

	/* Prepare to switch menus */
	else if (ddx[dir]) {
		out.type = EVT_SWITCH;
		out.key.code = ddx[dir] < 0 ? ARROW_LEFT : ARROW_RIGHT;
	}

	/* Move up or down to the next valid & visible row */
	else if (ddy[dir]) {
		m->cursor += ddy[dir];
		out.type = EVT_MOVE;
	}

	return out;
}